

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

CURLcode Curl_none_md5sum(uchar *input,size_t inputlen,uchar *md5sum,size_t md5len)

{
  uint len;
  CURLcode CVar1;
  MD5_context *context;
  
  context = Curl_MD5_init(Curl_DIGEST_MD5);
  if (context == (MD5_context *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    len = curlx_uztoui(inputlen);
    Curl_MD5_update(context,input,len);
    Curl_MD5_final(context,md5sum);
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

CURLcode Curl_none_md5sum(unsigned char *input, size_t inputlen,
                          unsigned char *md5sum, size_t md5len UNUSED_PARAM)
{
  MD5_context *MD5pw;

  (void)md5len;

  MD5pw = Curl_MD5_init(Curl_DIGEST_MD5);
  if(!MD5pw)
    return CURLE_OUT_OF_MEMORY;
  Curl_MD5_update(MD5pw, input, curlx_uztoui(inputlen));
  Curl_MD5_final(MD5pw, md5sum);
  return CURLE_OK;
}